

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestBusy::~TestBusy(TestBusy *this)

{
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x10);
  return;
}

Assistant:

Q_OBJECT

private slots:

	void testBusy()
	{
		QtMWidgets::BusyIndicator i;
		i.setRadius( 35 );
		i.setRunning( false );

		i.show();

		QVERIFY( QTest::qWaitForWindowActive( &i ) );

		QVERIFY( i.radius() == 35 );

		i.setRunning( true );

		QVERIFY( i.isRunning() == true );

		QTest::qWait( 500 );

		i.setRunning( false );

		QVERIFY( i.isRunning() == false );

		i.setColor( Qt::red );

		QVERIFY( i.color() == Qt::red );
	}